

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_x86.cpp
# Opt level: O3

int __thiscall ncnn::TanH_x86::forward_inplace(TanH_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar6 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    lVar7 = 0;
    do {
      pfVar8 = (float *)(bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                        (long)bottom_top_blob->data);
      if ((int)uVar6 < 4) {
        uVar5 = 0;
      }
      else {
        iVar4 = 3;
        do {
          auVar18._0_4_ = *pfVar8 * -2.0;
          auVar18._4_4_ = pfVar8[1] * -2.0;
          auVar18._8_4_ = pfVar8[2] * -2.0;
          auVar18._12_4_ = pfVar8[3] * -2.0;
          auVar2._8_4_ = 0x42b0c0a5;
          auVar2._0_8_ = 0x42b0c0a542b0c0a5;
          auVar2._12_4_ = 0x42b0c0a5;
          auVar19 = minps(auVar18,auVar2);
          auVar3._8_4_ = 0xc2b0c0a5;
          auVar3._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3._12_4_ = 0xc2b0c0a5;
          auVar19 = maxps(auVar19,auVar3);
          fVar14 = auVar19._0_4_ * 1.442695 + 0.5;
          fVar15 = auVar19._4_4_ * 1.442695 + 0.5;
          fVar16 = auVar19._8_4_ * 1.442695 + 0.5;
          fVar17 = auVar19._12_4_ * 1.442695 + 0.5;
          fVar10 = (float)(int)fVar14;
          fVar11 = (float)(int)fVar15;
          fVar12 = (float)(int)fVar16;
          fVar13 = (float)(int)fVar17;
          fVar10 = fVar10 - (float)(-(uint)(fVar14 < fVar10) & 0x3f800000);
          fVar11 = fVar11 - (float)(-(uint)(fVar15 < fVar11) & 0x3f800000);
          fVar12 = fVar12 - (float)(-(uint)(fVar16 < fVar12) & 0x3f800000);
          fVar13 = fVar13 - (float)(-(uint)(fVar17 < fVar13) & 0x3f800000);
          fVar14 = fVar10 * -0.6931472 + auVar19._0_4_;
          fVar15 = fVar11 * -0.6931472 + auVar19._4_4_;
          fVar16 = fVar12 * -0.6931472 + auVar19._8_4_;
          fVar17 = fVar13 * -0.6931472 + auVar19._12_4_;
          auVar19._4_4_ =
               (float)((int)fVar11 * 0x800000 + 0x3f800000) *
               (fVar15 + 1.0 +
               (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                 0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5) * fVar15 * fVar15) + 1.0;
          auVar19._0_4_ =
               (float)((int)fVar10 * 0x800000 + 0x3f800000) *
               (fVar14 + 1.0 +
               (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                 0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5) * fVar14 * fVar14) + 1.0;
          auVar19._8_4_ =
               (float)((int)fVar12 * 0x800000 + 0x3f800000) *
               (fVar16 + 1.0 +
               (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                 0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5) * fVar16 * fVar16) + 1.0;
          auVar19._12_4_ =
               (float)((int)fVar13 * 0x800000 + 0x3f800000) *
               (fVar17 + 1.0 +
               (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                 0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5) * fVar17 * fVar17) + 1.0;
          auVar19 = divps(_DAT_005a5220,auVar19);
          *pfVar8 = auVar19._0_4_ + -1.0;
          pfVar8[1] = auVar19._4_4_ + -1.0;
          pfVar8[2] = auVar19._8_4_ + -1.0;
          pfVar8[3] = auVar19._12_4_ + -1.0;
          pfVar8 = pfVar8 + 4;
          iVar4 = iVar4 + 4;
          uVar5 = uVar6 & 0xfffffffc;
        } while (iVar4 < (int)uVar6);
      }
      if (uVar6 - uVar5 != 0 && (int)uVar5 <= (int)uVar6) {
        lVar9 = 0;
        do {
          fVar10 = tanhf(pfVar8[lVar9]);
          pfVar8[lVar9] = fVar10;
          lVar9 = lVar9 + 1;
        } while (uVar6 - uVar5 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int TanH_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = tanh_avx512(_p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = tanh_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = tanh_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = tanhf(*ptr);
            ptr++;
        }
    }

    return 0;
}